

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O0

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::page_overflow(LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                *this,LfQueue_ProgressGuarantee i_progress_guarantee,uintptr_t i_tail)

{
  __int_type _Var1;
  uintptr_t uVar2;
  __int_type _Var3;
  bool bVar4;
  ControlBlock *block;
  unsigned_long future_tail;
  unsigned_long transient_tail;
  uintptr_t expected_tail;
  size_t uinits;
  uintptr_t page_end;
  uintptr_t i_tail_local;
  LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *pLStack_78;
  LfQueue_ProgressGuarantee i_progress_guarantee_local;
  LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *this_local;
  undefined1 local_61;
  __int_type local_60;
  undefined4 local_58;
  undefined4 local_54;
  __int_type local_50;
  unsigned_long *local_48;
  LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  *local_40;
  
  if (i_progress_guarantee == LfQueue_WaitFree) {
    this_local = (LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                  *)0x0;
  }
  else {
    page_end = i_tail;
    i_tail_local._4_4_ = i_progress_guarantee;
    pLStack_78 = this;
    uinits = (size_t)LFQueue_Base<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
                     ::get_end_control_block((void *)i_tail);
    if (page_end < uinits) {
      expected_tail = size_min(uinits - page_end >> 6,0x3f);
      transient_tail = page_end;
      _Var1 = page_end + expected_tail;
      uVar2 = page_end + expected_tail * 0x40;
      local_48 = &transient_tail;
      local_54 = 5;
      local_58 = 5;
      LOCK();
      _Var3 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
      local_61 = page_end == _Var3;
      if ((bool)local_61) {
        (this->m_tail).super___atomic_base<unsigned_long>._M_i = _Var1;
        _Var3 = page_end;
      }
      UNLOCK();
      if ((bool)local_61) {
        local_60 = _Var1;
        local_50 = _Var1;
        local_40 = this;
        raw_atomic_store((uintptr_t *)page_end,uVar2 + 2,memory_order_seq_cst);
        LOCK();
        _Var3 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
        bVar4 = _Var1 == _Var3;
        if (bVar4) {
          (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar2;
          _Var3 = _Var1;
        }
        UNLOCK();
        if (bVar4) {
          return uVar2;
        }
      }
      transient_tail = _Var3;
      this_local = (LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                    *)transient_tail;
    }
    else {
      this_local = (LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                    *)get_or_allocate_next_page(this,i_tail_local._4_4_,(ControlBlock *)page_end);
    }
  }
  return (uintptr_t)this_local;
}

Assistant:

DENSITY_NO_INLINE uintptr_t
                              page_overflow(LfQueue_ProgressGuarantee i_progress_guarantee, uintptr_t const i_tail)
            {
                DENSITY_ASSUME_UINT_ALIGNED(i_tail, s_alloc_granularity);

                // the memory protection currently used (pinning) is based on an atomic increment, that is not wait-free
                if (i_progress_guarantee == LfQueue_WaitFree)
                {
                    return 0;
                }

                auto const page_end = reinterpret_cast<uintptr_t>(
                  get_end_control_block(reinterpret_cast<void *>(i_tail)));
                if (i_tail < page_end)
                {
                    /* There is space between the (presumed) current tail and the end control block.
                        We try to pad it with a dead element. */
                    auto const uinits =
                      size_min((page_end - i_tail) / s_alloc_granularity, s_alloc_granularity - 1);
                    auto       expected_tail  = i_tail;
                    auto       transient_tail = i_tail + uinits;
                    auto const future_tail    = i_tail + uinits * s_alloc_granularity;
                    if (m_tail.compare_exchange_weak(
                          expected_tail, transient_tail, mem_relaxed, mem_relaxed))
                    {
                        // m_tail was successfully updated, now we can setup the padding element
                        auto const block = reinterpret_cast<ControlBlock *>(i_tail);
                        raw_atomic_store(&block->m_next, future_tail + LfQueue_Dead, mem_relaxed);
                        expected_tail = transient_tail;
                        if (m_tail.compare_exchange_strong(
                              expected_tail, future_tail, mem_relaxed, mem_relaxed))
                        {
                            return future_tail;
                        }
                    }

                    // we have in expected_tail an updated value of m_tail
                    return expected_tail;
                }
                else
                {
                    // get or allocate a new page
                    DENSITY_ASSUME(i_tail == page_end);
                    return reinterpret_cast<uintptr_t>(get_or_allocate_next_page(
                      i_progress_guarantee, reinterpret_cast<ControlBlock *>(i_tail)));
                }
            }